

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

int xmlXPtrCmpPoints(xmlNodePtr node1,int index1,xmlNodePtr node2,int index2)

{
  int index2_local;
  xmlNodePtr node2_local;
  int index1_local;
  xmlNodePtr node1_local;
  
  if ((node1 == (xmlNodePtr)0x0) || (node2 == (xmlNodePtr)0x0)) {
    node1_local._4_4_ = -2;
  }
  else if (node1 == node2) {
    if (index1 < index2) {
      node1_local._4_4_ = 1;
    }
    else if (index2 < index1) {
      node1_local._4_4_ = -1;
    }
    else {
      node1_local._4_4_ = 0;
    }
  }
  else {
    node1_local._4_4_ = xmlXPathCmpNodes(node1,node2);
  }
  return node1_local._4_4_;
}

Assistant:

static int
xmlXPtrCmpPoints(xmlNodePtr node1, int index1, xmlNodePtr node2, int index2) {
    if ((node1 == NULL) || (node2 == NULL))
	return(-2);
    /*
     * a couple of optimizations which will avoid computations in most cases
     */
    if (node1 == node2) {
	if (index1 < index2)
	    return(1);
	if (index1 > index2)
	    return(-1);
	return(0);
    }
    return(xmlXPathCmpNodes(node1, node2));
}